

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O0

void doitz(bool skipheader)

{
  FILE *__stream;
  size_t local_58;
  size_t i;
  undefined1 auStack_48 [4];
  VulnerabilityIndex idx;
  FILE *finy;
  FILE *finx;
  char *idxFileName;
  char *binFileName;
  bool skipheader_local;
  
  if (!skipheader) {
    printf("vulnerability_id,intensity_bin_id,damage_bin_id,probability\n");
  }
  __stream = fopen("vulnerability.bin.z","rb");
  idx.original_size = (longlong)fopen("vulnerability.idx.z","rb");
  if ((FILE *)idx.original_size == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: Vulnerability idx open failed\n");
    exit(1);
  }
  local_58 = fread((void *)((long)&i + 4),0x1c,1,(FILE *)idx.original_size);
  while (local_58 != 0) {
    fseek(__stream,_auStack_48,0);
    printrowsz(i._4_4_,(FILE *)__stream,idx.offset,idx.size);
    local_58 = fread((void *)((long)&i + 4),0x1c,1,(FILE *)idx.original_size);
  }
  fclose(__stream);
  fclose((FILE *)idx.original_size);
  return;
}

Assistant:

void doitz(bool skipheader)
{

	if (skipheader == false) {
		printf("vulnerability_id,intensity_bin_id,damage_bin_id,"
		       "probability\n");
	}

	const char *binFileName = "vulnerability.bin.z";
	const char *idxFileName = "vulnerability.idx.z";
	FILE *finx = fopen(binFileName, "rb");
	FILE *finy = fopen(idxFileName, "rb");
	if (finy == nullptr) {
		fprintf(stderr, "FATAL: Vulnerability idx open failed\n");
		exit(EXIT_FAILURE);
	}

	VulnerabilityIndex idx;

	size_t i = fread(&idx, sizeof(idx), 1, finy);
	while (i != 0) {
		flseek(finx, idx.offset, SEEK_SET);
		printrowsz(idx.vulnerability_id, finx, idx.size,
			   idx.original_size);
		i = fread(&idx, sizeof(idx), 1, finy);
	}

	fclose(finx);
	fclose(finy);

}